

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O2

OPJ_BOOL opj_j2k_write_updated_tlm
                   (opj_j2k_t *p_j2k,opj_stream_private *p_stream,opj_event_mgr *p_manager)

{
  int iVar1;
  OPJ_UINT32 OVar2;
  long lVar3;
  OPJ_BOOL OVar4;
  OPJ_OFF_T p_size;
  OPJ_SIZE_T OVar5;
  uint uVar6;
  ulong p_size_00;
  
  if (p_j2k == (opj_j2k_t *)0x0) {
    __assert_fail("p_j2k != 00",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cinecert[P]openjpeg/src/lib/openjp2/j2k.c"
                  ,0x32c4,
                  "OPJ_BOOL opj_j2k_write_updated_tlm(opj_j2k_t *, struct opj_stream_private *, struct opj_event_mgr *)"
                 );
  }
  if (p_manager != (opj_event_mgr *)0x0) {
    if (p_stream != (opj_stream_private *)0x0) {
      iVar1 = (p_j2k->m_specific_param).m_encoder.m_Ttlmi_is_byte;
      OVar2 = (p_j2k->m_specific_param).m_decoder.m_end_tile_x;
      lVar3 = (p_j2k->m_specific_param).m_encoder.m_tlm_start;
      p_size = opj_stream_tell(p_stream);
      OVar4 = opj_stream_seek(p_stream,lVar3 + 6,p_manager);
      if (OVar4 == 0) {
        uVar6 = 0;
      }
      else {
        uVar6 = 0;
        p_size_00 = (ulong)(((iVar1 == 0) + 5) * OVar2);
        OVar5 = opj_stream_write_data
                          (p_stream,(p_j2k->m_specific_param).m_encoder.m_tlm_sot_offsets_buffer,
                           p_size_00,p_manager);
        if (OVar5 == p_size_00) {
          OVar4 = opj_stream_seek(p_stream,p_size,p_manager);
          uVar6 = (uint)(OVar4 != 0);
        }
      }
      return uVar6;
    }
    __assert_fail("p_stream != 00",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cinecert[P]openjpeg/src/lib/openjp2/j2k.c"
                  ,0x32c6,
                  "OPJ_BOOL opj_j2k_write_updated_tlm(opj_j2k_t *, struct opj_stream_private *, struct opj_event_mgr *)"
                 );
  }
  __assert_fail("p_manager != 00",
                "/workspace/llm4binary/github/license_all_cmakelists_25/cinecert[P]openjpeg/src/lib/openjp2/j2k.c"
                ,0x32c5,
                "OPJ_BOOL opj_j2k_write_updated_tlm(opj_j2k_t *, struct opj_stream_private *, struct opj_event_mgr *)"
               );
}

Assistant:

static OPJ_BOOL opj_j2k_write_updated_tlm(opj_j2k_t *p_j2k,
        struct opj_stream_private *p_stream,
        struct opj_event_mgr * p_manager)
{
    OPJ_UINT32 l_tlm_size;
    OPJ_OFF_T l_tlm_position, l_current_position;
    OPJ_UINT32 size_per_tile_part;

    /* preconditions */
    assert(p_j2k != 00);
    assert(p_manager != 00);
    assert(p_stream != 00);

    size_per_tile_part = p_j2k->m_specific_param.m_encoder.m_Ttlmi_is_byte ? 5 : 6;
    l_tlm_size = size_per_tile_part *
                 p_j2k->m_specific_param.m_encoder.m_total_tile_parts;
    l_tlm_position = 6 + p_j2k->m_specific_param.m_encoder.m_tlm_start;
    l_current_position = opj_stream_tell(p_stream);

    if (! opj_stream_seek(p_stream, l_tlm_position, p_manager)) {
        return OPJ_FALSE;
    }

    if (opj_stream_write_data(p_stream,
                              p_j2k->m_specific_param.m_encoder.m_tlm_sot_offsets_buffer, l_tlm_size,
                              p_manager) != l_tlm_size) {
        return OPJ_FALSE;
    }

    if (! opj_stream_seek(p_stream, l_current_position, p_manager)) {
        return OPJ_FALSE;
    }

    return OPJ_TRUE;
}